

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O1

void duckdb::Bit::SetEmptyBitString(bitstring_t *target,string_t *input)

{
  ulong __n;
  char *pcVar1;
  char *__s;
  
  if ((target->value).pointer.length < 0xd) {
    __s = (target->value).pointer.prefix;
  }
  else {
    __s = (target->value).pointer.ptr;
  }
  __n = (ulong)(input->value).pointer.length;
  if (__n < 0xd) {
    pcVar1 = (input->value).pointer.prefix;
  }
  else {
    pcVar1 = (input->value).pointer.ptr;
  }
  switchD_0105b559::default(__s,0,__n);
  *__s = *pcVar1;
  Finalize(target);
  return;
}

Assistant:

void Bit::SetEmptyBitString(bitstring_t &target, string_t &input) {
	char *res_buf = target.GetDataWriteable();
	const char *buf = input.GetData();
	memset(res_buf, 0, input.GetSize());
	res_buf[0] = buf[0];
	Bit::Finalize(target);
}